

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseStringLiteral(char *in,char *end,Value **stringData)

{
  char *pcVar1;
  char *__src;
  Value *pVVar2;
  char *start;
  size_t len;
  Value **stringData_local;
  char *end_local;
  char *in_local;
  
  *stringData = (Value *)0x0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    end_local = lookForNextToken<char>(in,end);
    start = (char *)0x0;
    if (*end_local == '\"') {
      __src = end_local + 1;
      pcVar1 = end_local;
      while (end_local = pcVar1 + 1, *end_local != '\"' && end_local != end) {
        start = start + 1;
        pcVar1 = end_local;
      }
      pVVar2 = ValueAllocator::allocPrimData(ddl_string,(size_t)start);
      *stringData = pVVar2;
      strncpy((char *)(*stringData)->m_data,__src,(size_t)start);
      (*stringData)->m_data[(long)start] = '\0';
      end_local = pcVar1 + 2;
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseStringLiteral( char *in, char *end, Value **stringData ) {
    *stringData = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    size_t len( 0 );
    char *start( in );
    if( *start == '\"' ) {
        ++start;
        ++in;
        while( *in != '\"' && in != end ) {
            ++in;
            ++len;
        }

        *stringData = ValueAllocator::allocPrimData( Value::ddl_string, len );
        ::strncpy( ( char* ) ( *stringData )->m_data, start, len );
        ( *stringData )->m_data[len] = '\0';
        ++in;
    }

    return in;
}